

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v10::basic_format_parse_context<char>::check_arg_id
          (basic_format_parse_context<char> *this,int id)

{
  if (0 < this->next_arg_id_) {
    detail::throw_format_error("cannot switch from automatic to manual argument indexing");
  }
  this->next_arg_id_ = -1;
  return;
}

Assistant:

FMT_CONSTEXPR void check_arg_id(int id) {
    if (next_arg_id_ > 0) {
      detail::throw_format_error(
          "cannot switch from automatic to manual argument indexing");
      return;
    }
    next_arg_id_ = -1;
    do_check_arg_id(id);
  }